

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvers.cpp
# Opt level: O2

vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_> *
getPluckerCoord<float>
          (vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
           *__return_storage_ptr__,
          pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
          *lPair)

{
  Matrix<float,_3,_1,_0,_3,_1> dir1;
  Matrix<float,_3,_1,_0,_3,_1> local_158;
  Matrix<float,_3,_1,_0,_3,_1> local_148;
  Matrix<float,_3,_1,_0,_3,_1> p2;
  Matrix<float,_3,_1,_0,_3,_1> p1;
  Matrix<float,_3,_1,_0,_3,_1> dir2;
  Matrix<float,_6,_1,_0,_6,_1> l2;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_>
  local_e0;
  Matrix<float,_6,_1,_0,_6,_1> l1;
  
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            ((Type *)&l1,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)&(lPair->first).second,3
            );
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            ((Type *)&l2,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)lPair,3);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,-1,1,false>>::operator-
            (&local_e0,(MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>> *)&l1,
             (MatrixBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)&l2);
  Eigen::PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,float>,Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>const,Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>const>>
            ((PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>> *)&dir1,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_>_>
              *)&local_e0);
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            ((Type *)&l1,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)&(lPair->second).second,
             3);
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            ((Type *)&l2,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)&lPair->second,3);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,-1,1,false>>::operator-
            (&local_e0,(MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>> *)&l1,
             (MatrixBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)&l2);
  Eigen::PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,float>,Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>const,Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>const>>
            ((PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>> *)&dir2,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_>_>
              *)&local_e0);
  Eigen::MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::normalize
            ((MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&dir1);
  Eigen::MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::normalize
            ((MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&dir2);
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            ((Type *)&local_e0,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)lPair,3);
  Eigen::PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>>::
  PlainObjectBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>>
            ((PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>> *)&p1,
             (DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
             &local_e0);
  local_148.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       dir1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
       p1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] -
       p1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
       dir1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
  local_148.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       p1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
       dir1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] -
       dir1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
       p1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2];
  local_148.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       p1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] *
       dir1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] -
       dir1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] *
       p1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            ((Type *)&local_e0,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)&lPair->second,3);
  Eigen::PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>>::
  PlainObjectBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>>
            ((PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>> *)&p2,
             (DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
             &local_e0);
  local_158.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       dir2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
       p2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] -
       p2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
       dir2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
  local_158.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       p2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
       dir2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] -
       dir2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
       p2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2];
  local_158.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       p2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] *
       dir2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] -
       dir2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] *
       p2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
  Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
            ((Type *)&local_e0,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&l1,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>,Eigen::Matrix<float,3,1,0,3,1>>
            ((Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false> *)&local_e0,&dir1);
  Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::tail<int>
            ((Type *)&local_e0,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&l1,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>,Eigen::Matrix<float,3,1,0,3,1>>
            ((Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false> *)&local_e0,&local_148);
  Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
            ((Type *)&local_e0,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&l2,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>,Eigen::Matrix<float,3,1,0,3,1>>
            ((Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false> *)&local_e0,&dir2);
  Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::tail<int>
            ((Type *)&local_e0,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&l2,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>,Eigen::Matrix<float,3,1,0,3,1>>
            ((Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false> *)&local_e0,&local_158);
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
  ::push_back(__return_storage_ptr__,(value_type *)&l1);
  std::
  vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
  ::push_back(__return_storage_ptr__,&l2);
  return __return_storage_ptr__;
}

Assistant:

vector<Matrix<floatPrec, 6,1>> getPluckerCoord(std::pair<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>,std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>> lPair){

	// get line normalized direction
	Eigen::Matrix<floatPrec,3,1> dir1 = lPair.first.second.head(3) - lPair.first.first.head(3);
	Eigen::Matrix<floatPrec,3,1> dir2 = lPair.second.second.head(3) - lPair.second.first.head(3);
	dir1.normalize();
	dir2.normalize();
	// get moment vectors
	Eigen::Matrix<floatPrec,3,1> p1 = lPair.first.first.head(3);
	Eigen::Matrix<floatPrec,3,1> m1 = dir1.cross(p1);
	Eigen::Matrix<floatPrec,3,1> p2 = lPair.second.first.head(3);
	Eigen::Matrix<floatPrec,3,1> m2 = dir2.cross(p2);
	// get plucker coordinates
	Eigen::Matrix<floatPrec,6,1> l1;
	l1.head(3) = dir1; l1.tail(3) = m1;
	Eigen::Matrix<floatPrec,6,1> l2;
	l2.head(3) = dir2; l2.tail(3) = m2;

	vector<Matrix<floatPrec, 6,1>> lines;
	lines.push_back(l1); lines.push_back(l2);

	return lines;
}